

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O1

iterator __thiscall QJsonObject::findImpl<QStringView>(QJsonObject *this,QStringView key)

{
  QCborContainerPrivate *pQVar1;
  bool bVar2;
  qsizetype qVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  iterator iVar5;
  bool keyExists;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = false;
  if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
    uVar4 = 1;
  }
  else {
    qVar3 = indexOf<QStringView>(&this->o,key,&local_21);
    uVar4 = qVar3 - (qVar3 >> 0x3f) | 1;
  }
  bVar2 = local_21;
  detach(this,0);
  if (bVar2 == false) {
    pQVar1 = (this->o).d.ptr;
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar4 = (pQVar1->elements).d.size | 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    iVar5.item.super_QJsonValueConstRef._8_8_ = uVar4;
    iVar5.item.super_QJsonValueConstRef.field_0.o = this;
    return (iterator)iVar5.item.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::findImpl(T key)
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    detach();
    return {this, index / 2};
}